

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::BitState<unsigned_long>,long,duckdb::BitOrOperation>
               (long *idata,AggregateInputData *aggr_input_data,BitState<unsigned_long> **states,
               SelectionVector *isel,SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  BitState<unsigned_long> *pBVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  idx_t row_idx;
  idx_t i;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    psVar2 = isel->sel_vector;
    psVar3 = ssel->sel_vector;
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      uVar7 = uVar5;
      if (psVar2 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar2[uVar5];
      }
      uVar8 = uVar5;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar5];
      }
      pBVar1 = states[uVar8];
      uVar7 = idata[uVar7];
      if (pBVar1->is_set == false) {
        pBVar1->is_set = true;
      }
      else {
        uVar7 = uVar7 | pBVar1->value;
      }
      pBVar1->value = uVar7;
    }
  }
  else {
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      row_idx = iVar6;
      if (isel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)isel->sel_vector[iVar6];
      }
      iVar9 = iVar6;
      if (ssel->sel_vector != (sel_t *)0x0) {
        iVar9 = (idx_t)ssel->sel_vector[iVar6];
      }
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar4) {
        pBVar1 = states[iVar9];
        if (pBVar1->is_set == false) {
          pBVar1->value = idata[row_idx];
          pBVar1->is_set = true;
        }
        else {
          pBVar1->value = pBVar1->value | idata[row_idx];
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}